

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re_search.c
# Opt level: O1

int re_queryrepl(int f,int n)

{
  int iVar1;
  char *pcVar2;
  uint uVar3;
  char local_78 [8];
  char news [80];
  
  iVar1 = re_readpattern("RE Query replace");
  if (iVar1 != 1) {
    return iVar1;
  }
  uVar3 = 0;
  pcVar2 = eread("Query replace %s with: ",local_78,0x50,0x58,re_pat);
  if (pcVar2 == (char *)0x0) {
    return 2;
  }
  ewprintf("Query replacing %s with %s:",re_pat,local_78);
  iVar1 = re_forwsrch();
  if (iVar1 != 0) {
    uVar3 = 0;
    do {
      while( true ) {
        update(2);
        iVar1 = getkey(0);
        if (iVar1 < 0x21) break;
        if (iVar1 < 0x60) {
          if (iVar1 == 0x21) {
            do {
              iVar1 = re_doreplace(regex_match[0].rm_eo - regex_match[0].rm_so,local_78);
              if (iVar1 == 0) {
                return 0;
              }
              uVar3 = uVar3 + 1;
              iVar1 = re_forwsrch();
            } while (iVar1 != 0);
            goto LAB_00115a8e;
          }
          if (iVar1 == 0x2e) {
            iVar1 = re_doreplace(regex_match[0].rm_eo - regex_match[0].rm_so,local_78);
            if (iVar1 == 0) {
              return 0;
            }
            uVar3 = uVar3 + 1;
            goto LAB_00115a8e;
          }
        }
        else {
          if (iVar1 == 0x60) goto LAB_00115a8e;
          if (iVar1 == 0x7f) goto LAB_00115a26;
        }
LAB_00115a1a:
        ewprintf("<SP> replace, [.] rep-end, <DEL> don\'t, [!] repl rest <ESC> quit");
      }
      if (iVar1 == 7) {
        ctrlg(8,0);
        break;
      }
      if (iVar1 == 0x1b) break;
      if (iVar1 != 0x20) goto LAB_00115a1a;
      iVar1 = re_doreplace(regex_match[0].rm_eo - regex_match[0].rm_so,local_78);
      if (iVar1 == 0) {
        return 0;
      }
      uVar3 = uVar3 + 1;
LAB_00115a26:
      iVar1 = re_forwsrch();
    } while (iVar1 != 0);
  }
LAB_00115a8e:
  curwp->w_rflag = curwp->w_rflag | 8;
  update(2);
  if (inmacro == 0) {
    if (uVar3 == 1) {
      pcVar2 = "(1 replacement done)";
    }
    else {
      if (uVar3 != 0) {
        ewprintf("(%d replacements done)",(ulong)uVar3);
        return 1;
      }
      pcVar2 = "(No replacements done)";
    }
    ewprintf(pcVar2);
  }
  return 1;
}

Assistant:

int
re_queryrepl(int f, int n)
{
	int	rcnt = 0;		/* replacements made so far	*/
	int	plen, s;		/* length of found string	*/
	char	news[NPAT];		/* replacement string		*/

	if ((s = re_readpattern("RE Query replace")) != TRUE)
		return (s);
	if (eread("Query replace %s with: ", news, NPAT,
	    EFNUL | EFNEW | EFCR, re_pat) == NULL)
		return (ABORT);
	ewprintf("Query replacing %s with %s:", re_pat, news);

	/*
	 * Search forward repeatedly, checking each time whether to insert
	 * or not.  The "!" case makes the check always true, so it gets put
	 * into a tighter loop for efficiency.
	 */
	while (re_forwsrch() == TRUE) {
retry:
		update(CMODE);
		switch (getkey(FALSE)) {
		case ' ':
			plen = regex_match[0].rm_eo - regex_match[0].rm_so;
			if (re_doreplace((RSIZE)plen, news) == FALSE)
				return (FALSE);
			rcnt++;
			break;

		case '.':
			plen = regex_match[0].rm_eo - regex_match[0].rm_so;
			if (re_doreplace((RSIZE)plen, news) == FALSE)
				return (FALSE);
			rcnt++;
			goto stopsearch;

		case CCHR('G'):				/* ^G */
			(void)ctrlg(FFRAND, 0);
			goto stopsearch;
		case CCHR('['):				/* ESC */
		case '`':
			goto stopsearch;
		case '!':
			do {
				plen = regex_match[0].rm_eo - regex_match[0].rm_so;
				if (re_doreplace((RSIZE)plen, news) == FALSE)
					return (FALSE);
				rcnt++;
			} while (re_forwsrch() == TRUE);
			goto stopsearch;

		case CCHR('?'):				/* To not replace */
			break;

		default:
			ewprintf("<SP> replace, [.] rep-end, <DEL> don't, [!] repl rest <ESC> quit");
			goto retry;
		}
	}

stopsearch:
	curwp->w_rflag |= WFFULL;
	update(CMODE);
	if (!inmacro) {
		if (rcnt == 0)
			ewprintf("(No replacements done)");
		else if (rcnt == 1)
			ewprintf("(1 replacement done)");
		else
			ewprintf("(%d replacements done)", rcnt);
	}
	return (TRUE);
}